

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68010_rtd(m68k_info *info)

{
  byte bVar1;
  uint immediate;
  
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\x03';
  if ((info->type & 0x1e) != 0) {
    immediate = read_imm_16(info);
    build_absolute_jump_with_immediate(info,0x140,0,immediate);
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68010_rtd(m68k_info *info)
{
	set_insn_group(info, M68K_GRP_RET);
	LIMIT_CPU_TYPES(info, M68010_PLUS);
	build_absolute_jump_with_immediate(info, M68K_INS_RTD, 0, read_imm_16(info));
}